

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_read_format_zip.c
# Opt level: O0

void verify_contents(archive *a,int seeking,int improved_streaming)

{
  int in_EDX;
  wchar_t in_ESI;
  archive_entry **in_RDI;
  size_t in_stack_00000010;
  archive_entry *ae;
  char filedata [64];
  archive_entry **in_stack_ffffffffffffff88;
  archive_entry *paVar1;
  void *pvVar2;
  archive_entry **ppaVar3;
  archive_entry **ppaVar4;
  archive *in_stack_ffffffffffffff90;
  uint uVar6;
  archive *paVar5;
  char *in_stack_ffffffffffffff98;
  char *pcVar7;
  char *pcVar8;
  undefined4 in_stack_ffffffffffffffa0;
  wchar_t in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  wchar_t in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  archive *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  wchar_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  
  archive_read_next_header(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                      (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                      (longlong)in_RDI,(char *)0x22252f,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                      (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                      (char *)0x22256a,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                      (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                      (char *)0x2225a2,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                      (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                      (char *)0x2225da,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                      (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                      (char *)0x222612,in_stack_ffffffffffffffc0);
  uVar6 = (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)uVar6 << 0x20);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,pcVar8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                        (longlong)in_stack_ffffffffffffff98,pcVar8,0,(char *)0x2226a4,
                        in_stack_ffffffffffffffc0);
  }
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                      (longlong)in_stack_ffffffffffffff98,pcVar8,0,(char *)0x2226df,
                      in_stack_ffffffffffffffc0);
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,pcVar8,pvVar2);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                      (longlong)in_stack_ffffffffffffff98,pcVar8,(longlong)in_RDI,(char *)0x22274c,
                      in_stack_ffffffffffffffc0);
  ppaVar3 = (archive_entry **)0x8;
  paVar5 = (archive *)0x2ebd63;
  pcVar7 = (char *)0x0;
  assertion_equal_mem((char *)in_RDI,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)in_RDI,(char *)0x2227d5,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x222810,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x222848,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x222880,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2228b8,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x22294a,in_stack_ffffffffffffffc0);
  }
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,0,
                      (char *)0x222985,in_stack_ffffffffffffffc0);
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,pcVar8,pvVar2);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                      (longlong)in_RDI,(char *)0x2229f2,in_stack_ffffffffffffffc0);
  ppaVar3 = (archive_entry **)0x4;
  paVar5 = (archive *)0x2e4953;
  pcVar7 = (char *)0x0;
  assertion_equal_mem((char *)in_RDI,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)in_RDI,(char *)0x222a7b,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x222ab6,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x222aee,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x222b26,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x222b5e,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x222bf0,in_stack_ffffffffffffffc0);
  }
  if (in_ESI == L'\0') {
    archive_entry_size_is_set
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x222c6c,in_stack_ffffffffffffffc0);
  }
  else {
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x222c32,in_stack_ffffffffffffffc0);
  }
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                      (longlong)in_RDI,(char *)0x222cb0,in_stack_ffffffffffffffc0);
  ppaVar3 = (archive_entry **)0x5;
  paVar5 = (archive *)0x2eb7f2;
  pcVar8 = (char *)0x0;
  assertion_equal_mem((char *)in_RDI,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,(longlong)in_RDI,(char *)0x222d39,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x222d74,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x222dac,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x222de4,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x222e1c,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  paVar5 = (archive *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar8,
             (char *)paVar5,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI == L'\0') && (in_EDX == 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                        (char *)paVar5,0,(char *)0x222f73,in_stack_ffffffffffffffc0);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ppaVar3 = (archive_entry **)0x0;
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                        (char *)paVar5,0,(char *)0x222fae,in_stack_ffffffffffffffc0);
    archive_entry_size_is_set
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (wchar_t)((ulong)pcVar8 >> 0x20),(wchar_t)pcVar8,(char *)paVar5,ppaVar3);
  }
  else {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                        (char *)paVar5,0,(char *)0x222eb2,in_stack_ffffffffffffffc0);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    paVar1 = (archive_entry *)0x0;
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                        (char *)paVar5,0,(char *)0x222eea,in_stack_ffffffffffffffc0);
    archive_entry_symlink(paVar1);
    ppaVar3 = (archive_entry **)0x0;
    paVar5 = (archive *)((ulong)paVar5 & 0xffffffff00000000);
    assertion_equal_string
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar8,
               (char *)paVar5,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  }
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,(longlong)in_RDI,(char *)0x223015,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x223050,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x223088,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x2230c0,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x2230f8,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  paVar5 = (archive *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar8,
             (char *)paVar5,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                        (char *)paVar5,0,(char *)0x22318a,in_stack_ffffffffffffffc0);
  }
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x2231c2,in_stack_ffffffffffffffc0);
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)pcVar8 >> 0x20),(wchar_t)pcVar8,(char *)paVar5,pvVar2);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  ppaVar3 = in_RDI;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,(longlong)in_RDI,(char *)0x22322e,in_stack_ffffffffffffffc0);
  archive_read_next_header(paVar5,in_RDI);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,(longlong)ppaVar3,(char *)0x22326c,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x2232a7,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x2232df,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x223317,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,
                      (char *)paVar5,0,(char *)0x22334f,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar7 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar8,pcVar7,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,pcVar7,
                        0,(char *)0x2233e1,in_stack_ffffffffffffffc0);
  }
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,pcVar7,0,
                      (char *)0x22341c,in_stack_ffffffffffffffc0);
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)pcVar8 >> 0x20),(wchar_t)pcVar8,pcVar7,pvVar2);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar8,pcVar7,
                      (longlong)ppaVar3,(char *)0x223489,in_stack_ffffffffffffffc0);
  ppaVar4 = (archive_entry **)0x8;
  paVar5 = (archive *)0x2ebd63;
  pcVar7 = (char *)0x0;
  assertion_equal_mem((char *)ppaVar3,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar4);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar3,(char *)0x223512,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x22354d,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223585,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2235bd,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2235f5,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x223687,in_stack_ffffffffffffffc0);
  }
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,0,
                      (char *)0x2236c2,in_stack_ffffffffffffffc0);
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,pcVar8,pvVar2);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                      (longlong)ppaVar3,(char *)0x22372f,in_stack_ffffffffffffffc0);
  ppaVar4 = (archive_entry **)0x4;
  paVar5 = (archive *)0x2e4953;
  pcVar7 = (char *)0x0;
  assertion_equal_mem((char *)ppaVar3,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar4);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar3,(char *)0x2237b8,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2237f3,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x22382b,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223863,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x22389b,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x22392d,in_stack_ffffffffffffffc0);
  }
  if (in_ESI == L'\0') {
    archive_entry_size_is_set
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x2239a9,in_stack_ffffffffffffffc0);
  }
  else {
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x22396f,in_stack_ffffffffffffffc0);
  }
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                      (longlong)ppaVar3,(char *)0x2239ed,in_stack_ffffffffffffffc0);
  ppaVar4 = (archive_entry **)0x4;
  paVar5 = (archive *)0x2e4953;
  pcVar7 = (char *)0x0;
  assertion_equal_mem((char *)ppaVar3,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar4);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar3,(char *)0x223a76,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223ab1,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223ae9,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223b21,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223b59,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI == L'\0') && (in_EDX == 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x223cb0,in_stack_ffffffffffffffc0);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x223ceb,in_stack_ffffffffffffffc0);
    archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      (size_t)in_stack_ffffffffffffffb8);
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        (longlong)ppaVar3,(char *)0x223d2f,in_stack_ffffffffffffffc0);
    ppaVar4 = (archive_entry **)0x5;
    paVar5 = (archive *)0x2eb7f2;
    pcVar7 = (char *)0x0;
    assertion_equal_mem((char *)ppaVar3,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                        (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,
                        (void *)filedata._0_8_);
  }
  else {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x223bef,in_stack_ffffffffffffffc0);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    paVar1 = (archive_entry *)0x0;
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x223c27,in_stack_ffffffffffffffc0);
    archive_entry_symlink(paVar1);
    ppaVar4 = (archive_entry **)0x0;
    paVar5 = (archive *)((ulong)pcVar8 & 0xffffffff00000000);
    assertion_equal_string
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,
               (char *)paVar5,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  }
  archive_read_next_header(paVar5,ppaVar4);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar3,(char *)0x223db8,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223df3,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223e2b,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223e63,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223e9b,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  paVar5 = (archive *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,
             (char *)paVar5,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if (in_ESI != L'\0') {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                        (char *)paVar5,0,(char *)0x223f26,in_stack_ffffffffffffffc0);
  }
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x223f5e,in_stack_ffffffffffffffc0);
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,pvVar2);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  ppaVar4 = ppaVar3;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar3,(char *)0x223fca,in_stack_ffffffffffffffc0);
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar4,(char *)0x224008,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224043,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x22407b,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2240b3,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2240eb,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pvVar2 = (void *)0x0;
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    pvVar2 = (void *)0x0;
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x22417d,in_stack_ffffffffffffffc0);
  }
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,pcVar8,pvVar2);
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,pcVar8,pvVar2);
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,0,
                      (char *)0x22420a,in_stack_ffffffffffffffc0);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                      (longlong)ppaVar4,(char *)0x22424e,in_stack_ffffffffffffffc0);
  ppaVar3 = (archive_entry **)0x8;
  paVar5 = (archive *)0x2ebd63;
  pcVar7 = (char *)0x0;
  assertion_equal_mem((char *)ppaVar4,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar4,(char *)0x2242d7,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224312,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x22434a,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224382,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2243ba,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x22444c,in_stack_ffffffffffffffc0);
  }
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,0,
                      (char *)0x224487,in_stack_ffffffffffffffc0);
  archive_entry_size_is_set
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,pcVar8,pvVar2);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                      (longlong)ppaVar4,(char *)0x2244f4,in_stack_ffffffffffffffc0);
  ppaVar3 = (archive_entry **)0x4;
  paVar5 = (archive *)0x2e4953;
  pcVar7 = (char *)0x0;
  assertion_equal_mem((char *)ppaVar4,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar4,(char *)0x22457d,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2245b8,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2245f0,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224628,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224660,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x2246f2,in_stack_ffffffffffffffc0);
  }
  if (in_ESI == L'\0') {
    archive_entry_size_is_set
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x22476e,in_stack_ffffffffffffffc0);
  }
  else {
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x224734,in_stack_ffffffffffffffc0);
  }
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                      (longlong)ppaVar4,(char *)0x2247b2,in_stack_ffffffffffffffc0);
  ppaVar3 = (archive_entry **)0x4;
  paVar5 = (archive *)0x2e4953;
  pcVar7 = (char *)0x0;
  assertion_equal_mem((char *)ppaVar4,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,(void *)filedata._0_8_)
  ;
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar4,(char *)0x22483b,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224876,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2248ae,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x2248e6,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x22491e,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  pcVar8 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,pcVar8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI == L'\0') && (in_EDX == 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x224a75,in_stack_ffffffffffffffc0);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x224ab0,in_stack_ffffffffffffffc0);
    archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      (size_t)in_stack_ffffffffffffffb8);
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        (longlong)ppaVar4,(char *)0x224af4,in_stack_ffffffffffffffc0);
    ppaVar3 = (archive_entry **)0x5;
    paVar5 = (archive *)0x2eb7f2;
    pcVar7 = (char *)0x0;
    assertion_equal_mem((char *)ppaVar4,in_ESI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                        (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd0,in_stack_00000010,(char *)ae,
                        (void *)filedata._0_8_);
  }
  else {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x2249b4,in_stack_ffffffffffffffc0);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    paVar1 = (archive_entry *)0x0;
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,pcVar8,
                        0,(char *)0x2249ec,in_stack_ffffffffffffffc0);
    archive_entry_symlink(paVar1);
    ppaVar3 = (archive_entry **)0x0;
    paVar5 = (archive *)((ulong)pcVar8 & 0xffffffff00000000);
    assertion_equal_string
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,
               (char *)paVar5,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  }
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar4,(char *)0x224b7d,in_stack_ffffffffffffffc0);
  archive_entry_mtime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224bb8,in_stack_ffffffffffffffc0);
  archive_entry_mtime_nsec
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224bf0,in_stack_ffffffffffffffc0);
  archive_entry_atime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224c28,in_stack_ffffffffffffffc0);
  archive_entry_ctime((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                     );
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224c60,in_stack_ffffffffffffffc0);
  archive_entry_pathname(paVar1);
  paVar5 = (archive *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pcVar7,
             (char *)paVar5,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  if ((in_ESI != L'\0') || (in_EDX != 0)) {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                        (char *)paVar5,0,(char *)0x224cf2,in_stack_ffffffffffffffc0);
  }
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224d2a,in_stack_ffffffffffffffc0);
  archive_read_data(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (size_t)in_stack_ffffffffffffffb8);
  ppaVar3 = ppaVar4;
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar4,(char *)0x224d6d,in_stack_ffffffffffffffc0);
  archive_read_next_header(paVar5,ppaVar4);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,(longlong)ppaVar3,(char *)0x224dac,in_stack_ffffffffffffffc0);
  archive_read_close((archive *)0x224db6);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224de4,in_stack_ffffffffffffffc0);
  archive_read_free((archive *)0x224dee);
  assertion_equal_int(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(longlong)pcVar7,
                      (char *)paVar5,0,(char *)0x224e1c,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void
verify_contents(struct archive *a, int seeking, int improved_streaming)
{
	char filedata[64];
	struct archive_entry *ae;

	/*
	 * Default compression options:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(8, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(4, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "1234", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "mnopq", 5);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		/* Streaming cannot read file type, so
		 * symlink body shows as regular file contents. */
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir/", archive_entry_pathname(ae));
	if (seeking || improved_streaming)
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

#ifdef HAVE_ZLIB_H
	/*
	 * Deflate compression option:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(8, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(4, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "1234", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ghijk", 4);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assertEqualIntA(a, 5, archive_read_data(a, filedata, 10));
		assertEqualMem(filedata, "file1", 5);
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir_deflate/", archive_entry_pathname(ae));
	if (seeking) {
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));
#endif

	/*
	 * Store compression option:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assert(archive_entry_size_is_set(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(4, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ACEG", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming)
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ijklm", 4);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assertEqualIntA(a, 5, archive_read_data(a, filedata, 10));
		assertEqualMem(filedata, "file1", 5);
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir_stored/", archive_entry_pathname(ae));
	if (seeking || improved_streaming)
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}